

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  string *filename;
  undefined1 local_58 [8];
  string ext;
  allocator local_21;
  char *local_20;
  char *lang;
  cmSourceFile *this_local;
  
  lang = (char *)this;
  this_local = (cmSourceFile *)__return_storage_ptr__;
  pcVar2 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  local_20 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      bVar1 = cmSourceFileLocation::ExtensionIsAmbiguous(&this->Location);
      if ((bVar1) && (bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location), bVar1)) {
        GetFullPath(this,(string *)0x0);
      }
      else {
        filename = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
        cmsys::SystemTools::GetFilenameLastExtension((string *)local_58,filename);
        CheckLanguage(this,(string *)local_58);
        std::__cxx11::string::~string((string *)local_58);
      }
    }
    GetLanguage_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage()
{
  // If the language was set explicitly by the user then use it.
  if(const char* lang = this->GetProperty(propLANGUAGE))
    {
    return lang;
    }

  // Perform computation needed to get the language if necessary.
  if(this->FullPath.empty() && this->Language.empty())
    {
    // If a known extension is given or a known full path is given
    // then trust that the current extension is sufficient to
    // determine the language.  This will fail only if the user
    // specifies a full path to the source but leaves off the
    // extension, which is kind of weird.
    if(this->Location.ExtensionIsAmbiguous() &&
       this->Location.DirectoryIsAmbiguous())
      {
      // Finalize the file location to get the extension and set the
      // language.
      this->GetFullPath();
      }
    else
      {
      // Use the known extension to get the language if possible.
      std::string ext =
        cmSystemTools::GetFilenameLastExtension(this->Location.GetName());
      this->CheckLanguage(ext);
      }
    }

  // Now try to determine the language.
  return static_cast<cmSourceFile const*>(this)->GetLanguage();
}